

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O1

int xmlTextReaderValidatePop(xmlTextReaderPtr reader)

{
  int *piVar1;
  xmlNodePtr elem;
  xmlParserCtxtPtr pxVar2;
  xmlNs *pxVar3;
  xmlNodePtr pxVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  xmlChar *qname;
  xmlChar buf [50];
  xmlChar axStack_58 [56];
  
  elem = reader->node;
  if (((reader->validate == XML_TEXTREADER_VALIDATE_DTD) &&
      (pxVar2 = reader->ctxt, pxVar2 != (xmlParserCtxtPtr)0x0)) && (pxVar2->validate == 1)) {
    pxVar3 = elem->ns;
    if ((pxVar3 == (xmlNs *)0x0) || (pxVar3->prefix == (xmlChar *)0x0)) {
      uVar5 = xmlValidatePopElement(&pxVar2->vctxt,pxVar2->myDoc,elem,elem->name);
      piVar1 = &reader->ctxt->valid;
      *piVar1 = *piVar1 & uVar5;
    }
    else {
      qname = xmlBuildQName(elem->name,pxVar3->prefix,axStack_58,0x32);
      if (qname == (xmlChar *)0x0) {
        xmlTextReaderErrMemory(reader);
      }
      else {
        uVar5 = xmlValidatePopElement(&reader->ctxt->vctxt,reader->ctxt->myDoc,elem,qname);
        piVar1 = &reader->ctxt->valid;
        *piVar1 = *piVar1 & uVar5;
        if (qname != axStack_58) {
          (*xmlFree)(qname);
        }
      }
      if (qname == (xmlChar *)0x0) {
        return -1;
      }
    }
  }
  if ((reader->validate == XML_TEXTREADER_VALIDATE_RNG) &&
     (reader->rngValidCtxt != (xmlRelaxNGValidCtxtPtr)0x0)) {
    pxVar4 = reader->rngFullNode;
    if (pxVar4 == (xmlNodePtr)0x0) {
      iVar6 = xmlRelaxNGValidatePopElement(reader->rngValidCtxt,reader->ctxt->myDoc,elem);
      iVar7 = -1;
      if (iVar6 != 1) {
        reader->rngValidErrors = reader->rngValidErrors + 1;
      }
    }
    else {
      iVar7 = 0;
      if (elem == pxVar4) {
        reader->rngFullNode = (xmlNodePtr)0x0;
      }
    }
    if (pxVar4 != (xmlNodePtr)0x0) {
      return iVar7;
    }
  }
  return 0;
}

Assistant:

static int
xmlTextReaderValidatePop(xmlTextReaderPtr reader) {
    xmlNodePtr node = reader->node;

#ifdef LIBXML_VALID_ENABLED
    if ((reader->validate == XML_TEXTREADER_VALIDATE_DTD) &&
        (reader->ctxt != NULL) && (reader->ctxt->validate == 1)) {
	if ((node->ns == NULL) || (node->ns->prefix == NULL)) {
	    reader->ctxt->valid &= xmlValidatePopElement(&reader->ctxt->vctxt,
				    reader->ctxt->myDoc, node, node->name);
	} else {
            xmlChar buf[50];
	    xmlChar *qname;

	    qname = xmlBuildQName(node->name, node->ns->prefix, buf, 50);
            if (qname == NULL) {
                xmlTextReaderErrMemory(reader);
                return(-1);
            }
	    reader->ctxt->valid &= xmlValidatePopElement(&reader->ctxt->vctxt,
				    reader->ctxt->myDoc, node, qname);
            if (qname != buf)
	        xmlFree(qname);
	}
        /*if (reader->ctxt->errNo == XML_ERR_NO_MEMORY) {
            reader->mode = XML_TEXTREADER_MODE_ERROR;
            reader->state = XML_TEXTREADER_ERROR;
            return(-1);
        }*/
    }
#endif /* LIBXML_VALID_ENABLED */
#ifdef LIBXML_RELAXNG_ENABLED
    if ((reader->validate == XML_TEXTREADER_VALIDATE_RNG) &&
               (reader->rngValidCtxt != NULL)) {
	int ret;

	if (reader->rngFullNode != NULL) {
	    if (node == reader->rngFullNode)
	        reader->rngFullNode = NULL;
	    return(0);
	}
	ret = xmlRelaxNGValidatePopElement(reader->rngValidCtxt,
	                                   reader->ctxt->myDoc,
					   node);
	if (ret != 1)
	    reader->rngValidErrors++;
    }
#endif

    return(0);
}